

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O2

LPWSTR GetEnvironmentStringsW(void)

{
  int iVar1;
  LPWSTR pWVar2;
  int cchWideChar;
  int iVar3;
  LPWSTR lpWideCharStr;
  
  if (PAL_InitializeChakraCoreCalled) {
    PALCEnterCriticalSection(&gcsEnvironment);
    cchWideChar = 0;
    for (iVar3 = 0; palEnvironment[iVar3] != (LPCSTR)0x0; iVar3 = iVar3 + 1) {
      iVar1 = MultiByteToWideChar(0,0,palEnvironment[iVar3],-1,(LPWSTR)0x0,0);
      cchWideChar = cchWideChar + iVar1;
    }
    pWVar2 = (LPWSTR)PAL_malloc((long)(cchWideChar + 1) * 2);
    if (pWVar2 == (LPWSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032ec8d;
      SetLastError(8);
    }
    else {
      lpWideCharStr = pWVar2;
      for (iVar3 = 0; palEnvironment[iVar3] != (LPCSTR)0x0; iVar3 = iVar3 + 1) {
        iVar1 = MultiByteToWideChar(0,0,palEnvironment[iVar3],-1,lpWideCharStr,cchWideChar);
        lpWideCharStr = lpWideCharStr + iVar1;
        cchWideChar = cchWideChar - iVar1;
      }
      *lpWideCharStr = L'\0';
    }
    PALCLeaveCriticalSection(&gcsEnvironment);
    if (PAL_InitializeChakraCoreCalled != false) {
      return pWVar2;
    }
  }
LAB_0032ec8d:
  abort();
}

Assistant:

LPWSTR
PALAPI
GetEnvironmentStringsW(
               VOID)
{
    WCHAR *wenviron = NULL, *tempEnviron;
    int i, len, envNum;

    PERF_ENTRY(GetEnvironmentStringsW);
    ENTRY("GetEnvironmentStringsW()\n");

    PALCEnterCriticalSection(&gcsEnvironment);    

    envNum = 0;
    len    = 0;

    /* get total length of the bytes that we need to allocate */
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = MultiByteToWideChar(CP_ACP, 0, palEnvironment[i], -1, wenviron, 0);
        envNum += len;
    }

    wenviron = (WCHAR *)PAL_malloc(sizeof(WCHAR)* (envNum + 1));
    if (wenviron == NULL) 
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto EXIT;
    }

    len = 0;
    tempEnviron = wenviron;
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = MultiByteToWideChar(CP_ACP, 0, palEnvironment[i], -1, tempEnviron, envNum);
        tempEnviron += len;
        envNum      -= len;
    }

    *tempEnviron = 0; /* Put an extra NULL at the end */
    
 EXIT:
    PALCLeaveCriticalSection(&gcsEnvironment);

    LOGEXIT("GetEnvironmentStringsW returning %p\n", wenviron);
    PERF_EXIT(GetEnvironmentStringsW);
    return wenviron;
}